

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AnalysisManager.cpp
# Opt level: O0

AnalyzedScope * __thiscall
slang::analysis::AnalysisManager::getAnalyzedScope(AnalysisManager *this,Scope *scope)

{
  bool bVar1;
  __atomic_base<unsigned_long> __name;
  group_type *pgVar2;
  equal_to<const_slang::ast::Scope_*> *this_00;
  anon_class_16_2_87ec82a1 *this_01;
  long in_RDI;
  AnalyzedScope *result;
  size_t hash;
  shared_lock_guard lck;
  uint n;
  group_shared_lock_guard lck_1;
  value_type *p;
  int mask;
  group_type *pg;
  size_t pos;
  prober pb;
  Scope **in_stack_fffffffffffffe38;
  undefined7 in_stack_fffffffffffffe40;
  undefined1 in_stack_fffffffffffffe47;
  element_type *in_stack_fffffffffffffe48;
  uint in_stack_fffffffffffffe54;
  concurrent_table<boost::unordered::detail::foa::flat_map_types<const_slang::ast::Scope_*,_std::optional<const_slang::analysis::AnalyzedScope_*>_>,_slang::hash<const_slang::ast::Scope_*,_void>,_std::equal_to<const_slang::ast::Scope_*>,_std::allocator<std::pair<const_slang::ast::Scope_*const,_std::optional<const_slang::analysis::AnalyzedScope_*>_>_>_>
  *in_stack_fffffffffffffe58;
  group_type *pgVar3;
  undefined1 local_158 [8];
  AnalyzedScope *local_150 [3];
  group_type *local_138;
  char *local_130;
  AnalyzedScope **local_128;
  AnalyzedScope ***local_120;
  group_type *local_118;
  char *local_110;
  size_t local_f8;
  AnalyzedScope ***local_e0;
  group_type *local_d8;
  char *local_d0;
  AnalyzedScope ***local_c8;
  undefined1 *local_c0;
  AnalyzedScope ***local_b8;
  size_t local_b0;
  size_t local_a8;
  group_type *local_a0;
  char *local_98;
  undefined1 local_89;
  int local_88;
  uint local_74;
  undefined1 local_70 [64];
  AnalyzedScope ****local_30;
  size_t local_28;
  size_t local_20;
  group_type *local_18;
  atomic<unsigned_long> local_10;
  uchar local_8 [8];
  
  local_150[0] = (AnalyzedScope *)0x0;
  __name._M_i = in_RDI + 0x28;
  local_128 = local_150;
  local_138 = (group_type *)local_158;
  local_120 = &local_128;
  local_130 = (char *)__name._M_i;
  local_118 = local_138;
  local_110 = (char *)__name._M_i;
  local_e0 = local_120;
  local_d8 = local_138;
  local_d0 = (char *)__name._M_i;
  boost::unordered::detail::foa::
  concurrent_table<boost::unordered::detail::foa::flat_map_types<const_slang::ast::Scope_*,_std::optional<const_slang::analysis::AnalyzedScope_*>_>,_slang::hash<const_slang::ast::Scope_*,_void>,_std::equal_to<const_slang::ast::Scope_*>,_std::allocator<std::pair<const_slang::ast::Scope_*const,_std::optional<const_slang::analysis::AnalyzedScope_*>_>_>_>
  ::shared_access(in_stack_fffffffffffffe58);
  local_f8 = boost::unordered::detail::foa::
             table_core<boost::unordered::detail::foa::flat_map_types<slang::ast::Scope_const*,std::optional<slang::analysis::AnalyzedScope_const*>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::atomic_integral>,boost::unordered::detail::foa::concurrent_table_arrays,boost::unordered::detail::foa::atomic_size_control,slang::hash<slang::ast::Scope_const*,void>,std::equal_to<slang::ast::Scope_const*>,std::allocator<std::pair<slang::ast::Scope_const*const,std::optional<slang::analysis::AnalyzedScope_const*>>>>
             ::hash_for<slang::ast::Scope_const*>
                       ((table_core<boost::unordered::detail::foa::flat_map_types<const_slang::ast::Scope_*,_std::optional<const_slang::analysis::AnalyzedScope_*>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::atomic_integral>,_boost::unordered::detail::foa::concurrent_table_arrays,_boost::unordered::detail::foa::atomic_size_control,_slang::hash<const_slang::ast::Scope_*,_void>,_std::equal_to<const_slang::ast::Scope_*>,_std::allocator<std::pair<const_slang::ast::Scope_*const,_std::optional<const_slang::analysis::AnalyzedScope_*>_>_>_>
                         *)CONCAT17(in_stack_fffffffffffffe47,in_stack_fffffffffffffe40),
                        in_stack_fffffffffffffe38);
  pgVar3 = local_d8;
  local_a8 = boost::unordered::detail::foa::
             table_core<boost::unordered::detail::foa::flat_map_types<const_slang::ast::Scope_*,_std::optional<const_slang::analysis::AnalyzedScope_*>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::atomic_integral>,_boost::unordered::detail::foa::concurrent_table_arrays,_boost::unordered::detail::foa::atomic_size_control,_slang::hash<const_slang::ast::Scope_*,_void>,_std::equal_to<const_slang::ast::Scope_*>,_std::allocator<std::pair<const_slang::ast::Scope_*const,_std::optional<const_slang::analysis::AnalyzedScope_*>_>_>_>
             ::position_for((table_core<boost::unordered::detail::foa::flat_map_types<const_slang::ast::Scope_*,_std::optional<const_slang::analysis::AnalyzedScope_*>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::atomic_integral>,_boost::unordered::detail::foa::concurrent_table_arrays,_boost::unordered::detail::foa::atomic_size_control,_slang::hash<const_slang::ast::Scope_*,_void>,_std::equal_to<const_slang::ast::Scope_*>,_std::allocator<std::pair<const_slang::ast::Scope_*const,_std::optional<const_slang::analysis::AnalyzedScope_*>_>_>_>
                             *)CONCAT17(in_stack_fffffffffffffe47,in_stack_fffffffffffffe40),
                            (size_t)in_stack_fffffffffffffe38);
  local_a0 = pgVar3;
  local_b0 = local_f8;
  local_b8 = local_e0;
  local_c8 = local_e0;
  local_c0 = &local_89;
  local_18 = pgVar3;
  local_28 = local_f8;
  local_30 = &local_c8;
  local_98 = (char *)__name._M_i;
  local_20 = local_a8;
  local_10.super___atomic_base<unsigned_long>._M_i =
       (__atomic_base<unsigned_long>)(__atomic_base<unsigned_long>)__name._M_i;
  boost::unordered::detail::foa::pow2_quadratic_prober::pow2_quadratic_prober
            ((pow2_quadratic_prober *)(local_70 + 0x30),local_a8);
  do {
    local_70._40_8_ =
         boost::unordered::detail::foa::pow2_quadratic_prober::get
                   ((pow2_quadratic_prober *)(local_70 + 0x30));
    pgVar2 = boost::unordered::detail::foa::
             table_arrays<std::pair<const_slang::ast::Scope_*const,_std::optional<const_slang::analysis::AnalyzedScope_*>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::atomic_integral>,_boost::unordered::detail::foa::pow2_size_policy,_std::allocator<std::pair<const_slang::ast::Scope_*const,_std::optional<const_slang::analysis::AnalyzedScope_*>_>_>_>
             ::groups((table_arrays<std::pair<const_slang::ast::Scope_*const,_std::optional<const_slang::analysis::AnalyzedScope_*>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::atomic_integral>,_boost::unordered::detail::foa::pow2_size_policy,_std::allocator<std::pair<const_slang::ast::Scope_*const,_std::optional<const_slang::analysis::AnalyzedScope_*>_>_>_>
                       *)0xabdbf3);
    local_70._32_8_ = pgVar2 + local_70._40_8_;
    local_70._28_4_ =
         boost::unordered::detail::foa::group15<boost::unordered::detail::foa::atomic_integral>::
         match((group15<boost::unordered::detail::foa::atomic_integral> *)in_stack_fffffffffffffe48,
               CONCAT17(in_stack_fffffffffffffe47,in_stack_fffffffffffffe40));
    if (local_70._28_4_ != 0) {
      local_70._16_8_ =
           boost::unordered::detail::foa::
           table_arrays<std::pair<const_slang::ast::Scope_*const,_std::optional<const_slang::analysis::AnalyzedScope_*>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::atomic_integral>,_boost::unordered::detail::foa::pow2_size_policy,_std::allocator<std::pair<const_slang::ast::Scope_*const,_std::optional<const_slang::analysis::AnalyzedScope_*>_>_>_>
           ::elements((table_arrays<std::pair<const_slang::ast::Scope_*const,_std::optional<const_slang::analysis::AnalyzedScope_*>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::atomic_integral>,_boost::unordered::detail::foa::pow2_size_policy,_std::allocator<std::pair<const_slang::ast::Scope_*const,_std::optional<const_slang::analysis::AnalyzedScope_*>_>_>_>
                       *)0xabdc48);
      local_70._16_8_ = local_70._16_8_ + local_70._40_8_ * 0xf * 0x18;
      boost::unordered::detail::foa::
      concurrent_table<boost::unordered::detail::foa::flat_map_types<const_slang::ast::Scope_*,_std::optional<const_slang::analysis::AnalyzedScope_*>_>,_slang::hash<const_slang::ast::Scope_*,_void>,_std::equal_to<const_slang::ast::Scope_*>,_std::allocator<std::pair<const_slang::ast::Scope_*const,_std::optional<const_slang::analysis::AnalyzedScope_*>_>_>_>
      ::access((concurrent_table<boost::unordered::detail::foa::flat_map_types<const_slang::ast::Scope_*,_std::optional<const_slang::analysis::AnalyzedScope_*>_>,_slang::hash<const_slang::ast::Scope_*,_void>,_std::equal_to<const_slang::ast::Scope_*>,_std::allocator<std::pair<const_slang::ast::Scope_*const,_std::optional<const_slang::analysis::AnalyzedScope_*>_>_>_>
                *)local_70,(char *)__name._M_i,(int)local_70._40_8_);
      do {
        local_74 = boost::unordered::detail::foa::unchecked_countr_zero(0);
        bVar1 = boost::unordered::detail::foa::
                group15<boost::unordered::detail::foa::atomic_integral>::is_occupied
                          ((group15<boost::unordered::detail::foa::atomic_integral> *)
                           CONCAT17(in_stack_fffffffffffffe47,in_stack_fffffffffffffe40),
                           (size_t)in_stack_fffffffffffffe38);
        if (bVar1) {
          this_00 = boost::unordered::detail::foa::
                    table_core<boost::unordered::detail::foa::flat_map_types<const_slang::ast::Scope_*,_std::optional<const_slang::analysis::AnalyzedScope_*>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::atomic_integral>,_boost::unordered::detail::foa::concurrent_table_arrays,_boost::unordered::detail::foa::atomic_size_control,_slang::hash<const_slang::ast::Scope_*,_void>,_std::equal_to<const_slang::ast::Scope_*>,_std::allocator<std::pair<const_slang::ast::Scope_*const,_std::optional<const_slang::analysis::AnalyzedScope_*>_>_>_>
                    ::pred((table_core<boost::unordered::detail::foa::flat_map_types<const_slang::ast::Scope_*,_std::optional<const_slang::analysis::AnalyzedScope_*>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::atomic_integral>,_boost::unordered::detail::foa::concurrent_table_arrays,_boost::unordered::detail::foa::atomic_size_control,_slang::hash<const_slang::ast::Scope_*,_void>,_std::equal_to<const_slang::ast::Scope_*>,_std::allocator<std::pair<const_slang::ast::Scope_*const,_std::optional<const_slang::analysis::AnalyzedScope_*>_>_>_>
                            *)0xabdcd1);
          pgVar3 = local_18;
          this_01 = (anon_class_16_2_87ec82a1 *)
                    boost::unordered::detail::foa::
                    table_core<boost::unordered::detail::foa::flat_map_types<slang::ast::Scope_const*,std::optional<slang::analysis::AnalyzedScope_const*>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::atomic_integral>,boost::unordered::detail::foa::concurrent_table_arrays,boost::unordered::detail::foa::atomic_size_control,slang::hash<slang::ast::Scope_const*,void>,std::equal_to<slang::ast::Scope_const*>,std::allocator<std::pair<slang::ast::Scope_const*const,std::optional<slang::analysis::AnalyzedScope_const*>>>>
                    ::
                    key_from<std::pair<slang::ast::Scope_const*const,std::optional<slang::analysis::AnalyzedScope_const*>>>
                              ((pair<const_slang::ast::Scope_*const,_std::optional<const_slang::analysis::AnalyzedScope_*>_>
                                *)0xabdd01);
          bVar1 = std::equal_to<const_slang::ast::Scope_*>::operator()
                            (this_00,(Scope **)pgVar3,(Scope **)this_01);
          in_stack_fffffffffffffe54 = CONCAT13(bVar1,(int3)in_stack_fffffffffffffe54);
          if (bVar1) {
            boost::unordered::detail::foa::
            concurrent_table<boost::unordered::detail::foa::flat_map_types<const_slang::ast::Scope_*,_std::optional<const_slang::analysis::AnalyzedScope_*>_>,_slang::hash<const_slang::ast::Scope_*,_void>,_std::equal_to<const_slang::ast::Scope_*>,_std::allocator<std::pair<const_slang::ast::Scope_*const,_std::optional<const_slang::analysis::AnalyzedScope_*>_>_>_>
            ::
            unprotected_visit<std::integral_constant<bool,_false>,_const_slang::ast::Scope_*,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/MikePopoloski[P]slang/source/analysis/AnalysisManager.cpp:119:35)_&>
            ::anon_class_16_2_87ec82a1::operator()
                      (this_01,pgVar3,in_stack_fffffffffffffe54,in_stack_fffffffffffffe48);
            local_8[0] = '\x01';
            local_8[1] = '\0';
            local_8[2] = '\0';
            local_8[3] = '\0';
            local_8[4] = '\0';
            local_8[5] = '\0';
            local_8[6] = '\0';
            local_8[7] = '\0';
            local_88 = 1;
            goto LAB_00abddeb;
          }
        }
        local_70._28_4_ = local_70._28_4_ - 1 & local_70._28_4_;
      } while (local_70._28_4_ != 0);
      local_88 = 0;
LAB_00abddeb:
      boost::unordered::detail::foa::shared_lock<boost::unordered::detail::foa::rw_spinlock>::
      ~shared_lock((shared_lock<boost::unordered::detail::foa::rw_spinlock> *)
                   CONCAT17(in_stack_fffffffffffffe47,in_stack_fffffffffffffe40));
      if (local_88 != 0) goto LAB_00abde68;
    }
    in_stack_fffffffffffffe47 =
         boost::unordered::detail::foa::group15<boost::unordered::detail::foa::atomic_integral>::
         is_not_overflowed((group15<boost::unordered::detail::foa::atomic_integral> *)
                           CONCAT17(in_stack_fffffffffffffe47,in_stack_fffffffffffffe40),
                           (size_t)in_stack_fffffffffffffe38);
    if ((bool)in_stack_fffffffffffffe47) {
      local_8[0] = '\0';
      local_8[1] = '\0';
      local_8[2] = '\0';
      local_8[3] = '\0';
      local_8[4] = '\0';
      local_8[5] = '\0';
      local_8[6] = '\0';
      local_8[7] = '\0';
      goto LAB_00abde68;
    }
    bVar1 = boost::unordered::detail::foa::pow2_quadratic_prober::next
                      ((pow2_quadratic_prober *)(local_70 + 0x30),*(size_t *)(in_RDI + 0x30));
    if (!bVar1) {
      local_8[0] = '\0';
      local_8[1] = '\0';
      local_8[2] = '\0';
      local_8[3] = '\0';
      local_8[4] = '\0';
      local_8[5] = '\0';
      local_8[6] = '\0';
      local_8[7] = '\0';
LAB_00abde68:
      boost::unordered::detail::foa::
      reentrancy_checked<boost::unordered::detail::foa::shared_lock<boost::unordered::detail::foa::rw_spinlock>_>
      ::~reentrancy_checked
                ((reentrancy_checked<boost::unordered::detail::foa::shared_lock<boost::unordered::detail::foa::rw_spinlock>_>
                  *)0xabdeb9);
      return local_150[0];
    }
  } while( true );
}

Assistant:

const AnalyzedScope* AnalysisManager::getAnalyzedScope(const Scope& scope) {
    const AnalyzedScope* result = nullptr;
    analyzedScopes.cvisit(&scope, [&result](auto& item) {
        if (item.second)
            result = *item.second;
    });
    return result;
}